

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void deferred_ping(void *arg,void *arg2)

{
  fio_defer_task_s task;
  fio_protocol_s *pr_00;
  int iVar1;
  fio_protocol_s *pr;
  void *arg2_local;
  void *arg_local;
  
  iVar1 = (int)((ulong)arg >> 8);
  if ((*(long *)((long)fio_data + (long)iVar1 * 0xa8 + 0x58) != 0) &&
     ((*(char *)((long)fio_data + (long)iVar1 * 0xa8 + 0x6a) == '\0' ||
      ((long)((ulong)*(byte *)((long)fio_data + (long)iVar1 * 0xa8 + 0x6a) +
             *(long *)((long)fio_data + (long)iVar1 * 0xa8 + 0x60)) <= (fio_data->last_cycle).tv_sec
      )))) {
    pr_00 = protocol_try_lock((long)iVar1,FIO_PR_LOCK_WRITE);
    if (pr_00 == (fio_protocol_s *)0x0) {
      task.arg1 = arg;
      task.func = deferred_ping;
      task.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task,&task_queue_normal);
      fio_defer_thread_signal();
    }
    else {
      (*pr_00->ping)((intptr_t)arg,pr_00);
      protocol_unlock(pr_00,FIO_PR_LOCK_WRITE);
    }
  }
  return;
}

Assistant:

static void deferred_ping(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol ||
      (uuid_data(arg).timeout &&
       (uuid_data(arg).timeout + uuid_data(arg).active >
        (fio_data->last_cycle.tv_sec)))) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_WRITE);
  if (!pr)
    goto postpone;
  pr->ping((intptr_t)arg, pr);
  protocol_unlock(pr, FIO_PR_LOCK_WRITE);
  return;
postpone:
  fio_defer_push_task(deferred_ping, arg, NULL);
  (void)arg2;
}